

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_fwd_tab_len(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar4;
  int iVar5;
  TRef TVar6;
  ushort uVar7;
  ulong uVar8;
  ushort uVar3;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar3 = J->chain[0x48];
  if (J->chain[0x48] <= uVar1) {
    uVar3 = uVar1;
  }
  uVar2 = J->chain[0x49];
  uVar7 = uVar3;
  if (uVar3 < uVar2) {
    pIVar4 = (J->cur).ir;
    do {
      uVar8 = (ulong)*(ushort *)((long)pIVar4 + (ulong)pIVar4[uVar2].field_0.op1 * 8 + 2);
      if (*(char *)((long)pIVar4 + uVar8 * 8 + 5) == '\x1e') {
        uVar8 = (ulong)pIVar4[uVar8].field_0.op1;
      }
      uVar7 = uVar2;
    } while (((*(byte *)((long)pIVar4 + uVar8 * 8 + 4) & 0x1f) != 0xe) &&
            (uVar2 = *(ushort *)((long)pIVar4 + (ulong)uVar2 * 8 + 6), uVar7 = uVar3, uVar3 < uVar2)
            );
  }
  iVar5 = fwd_aa_tab_clear(J,(uint)uVar7,(uint)uVar1);
  if (iVar5 == 0) {
    TVar6 = lj_ir_emit(J);
    return TVar6;
  }
  TVar6 = lj_opt_cselim(J,(uint)uVar7);
  return TVar6;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_tab_len(jit_State *J)
{
  IRRef tab = fins->op1;  /* Table reference. */
  IRRef lim = tab;  /* Search limit. */
  IRRef ref;

  /* Any ASTORE is a conflict and limits the search. */
  if (J->chain[IR_ASTORE] > lim) lim = J->chain[IR_ASTORE];

  /* Search for conflicting HSTORE with numeric key. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    IRIns *href = IR(store->op1);
    IRIns *key = IR(href->op2);
    if (irt_isnum(key->o == IR_KSLOT ? IR(key->op1)->t : key->t)) {
      lim = ref;  /* Conflicting store found, limits search for TLEN. */
      break;
    }
    ref = store->prev;
  }

  /* Search for aliasing table.clear. */
  if (!fwd_aa_tab_clear(J, lim, tab))
    return lj_ir_emit(J);

  /* Try to find a matching load. Below the conflicting store, if any. */
  return lj_opt_cselim(J, lim);
}